

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

string * RigidBodyDynamics::Utils::print_hierarchy_abi_cxx11_
                   (Model *model,uint body_index,int indent)

{
  _Ios_Openmode _Var1;
  const_reference pvVar2;
  const_reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference pvVar6;
  undefined8 uVar7;
  ostream *poVar8;
  const_reference pvVar9;
  int in_ECX;
  value_type in_EDX;
  long in_RSI;
  string *in_RDI;
  int j_1;
  uint fbody_index;
  uint child_index;
  uint ci;
  ostringstream errormsg;
  int j;
  stringstream result;
  string *in_stack_fffffffffffffac8;
  RBDLError *in_stack_fffffffffffffad0;
  Model *in_stack_fffffffffffffad8;
  allocator<char> *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  Model *in_stack_fffffffffffffaf8;
  string local_470 [32];
  int local_450;
  uint local_44c;
  string local_448 [36];
  uint local_424;
  string local_420 [32];
  string local_400 [39];
  undefined1 local_3d9;
  string local_3b8 [36];
  uint local_394;
  string local_390 [32];
  ostringstream local_370 [376];
  string local_1f8 [32];
  int local_1d8;
  allocator<char> local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  SpatialVector *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,local_1c0,_Var1);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  for (local_1d8 = 0; local_1d8 < in_ECX; local_1d8 = local_1d8 + 1) {
    std::operator<<((ostream *)&stack0xfffffffffffffe70,"  ");
  }
  get_body_name_abi_cxx11_
            (in_stack_fffffffffffffad8,(uint)((ulong)in_stack_fffffffffffffad0 >> 0x20));
  std::operator<<((ostream *)&stack0xfffffffffffffe70,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  if (in_EDX != 0) {
    std::operator<<((ostream *)&stack0xfffffffffffffe70," [ ");
  }
  do {
    pvVar2 = std::
             vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
             operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)(in_RSI + 0x338),(ulong)in_EDX);
    if ((pvVar2->mIsVirtual & 1U) == 0) {
LAB_006b2448:
      if (in_EDX != 0) {
        poVar8 = (ostream *)&stack0xfffffffffffffe70;
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0xb8),(ulong)in_EDX);
        get_dof_name_abi_cxx11_(in_stack_ffffffffffffff68);
        poVar8 = std::operator<<(poVar8,local_420);
        std::operator<<(poVar8," ]");
        std::__cxx11::string::~string(local_420);
      }
      std::ostream::operator<<(&stack0xfffffffffffffe70,std::endl<char,std::char_traits<char>>);
      local_424 = 0;
      while( true ) {
        uVar5 = (ulong)local_424;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
        if (sVar4 <= uVar5) break;
        poVar8 = (ostream *)&stack0xfffffffffffffe70;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (pvVar3,(ulong)local_424);
        print_hierarchy_abi_cxx11_
                  ((Model *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
                   in_stack_ffffffffffffffe0);
        std::operator<<(poVar8,local_448);
        std::__cxx11::string::~string(local_448);
        local_424 = local_424 + 1;
      }
      for (local_44c = 0; uVar5 = (ulong)local_44c,
          sVar4 = std::
                  vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                  ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                          *)(in_RSI + 0x318)), uVar5 < sVar4; local_44c = local_44c + 1) {
        pvVar9 = std::
                 vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                               *)(in_RSI + 0x318),(ulong)local_44c);
        if (pvVar9->mMovableParent == in_EDX) {
          for (local_450 = 0; local_450 < in_ECX + 1; local_450 = local_450 + 1) {
            std::operator<<((ostream *)&stack0xfffffffffffffe70,"  ");
          }
          Model::GetBodyName_abi_cxx11_
                    (in_stack_fffffffffffffaf8,(uint)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
          poVar8 = std::operator<<((ostream *)&stack0xfffffffffffffe70,local_470);
          poVar8 = std::operator<<(poVar8," [fixed]");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_470);
        }
      }
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return in_RDI;
    }
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RSI + 0x30),(ulong)in_EDX);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    if (sVar4 == 0) {
      std::operator<<((ostream *)&stack0xfffffffffffffe70," end");
      goto LAB_006b2448;
    }
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RSI + 0x30),(ulong)in_EDX);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    if (1 < sVar4) {
      std::__cxx11::ostringstream::ostringstream(local_370);
      poVar8 = (ostream *)std::ostream::operator<<(local_370,std::endl<char,std::char_traits<char>>)
      ;
      poVar8 = std::operator<<(poVar8,
                               "Error: Cannot determine multi-dof joint as massless body with id ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_EDX);
      poVar8 = std::operator<<(poVar8," (name: ");
      Model::GetBodyName_abi_cxx11_
                (in_stack_fffffffffffffaf8,(uint)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
      poVar8 = std::operator<<(poVar8,local_390);
      poVar8 = std::operator<<(poVar8,") has more than one child:");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_390);
      local_394 = 0;
      while( true ) {
        uVar5 = (ulong)local_394;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
        if (sVar4 <= uVar5) break;
        poVar8 = std::operator<<((ostream *)local_370,"  id: ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar3,(ulong)local_394);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar6);
        poVar8 = std::operator<<(poVar8," name: ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (pvVar3,(ulong)local_394);
        Model::GetBodyName_abi_cxx11_
                  (in_stack_fffffffffffffaf8,(uint)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
        poVar8 = std::operator<<(poVar8,local_3b8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_3b8);
        local_394 = local_394 + 1;
      }
      local_3d9 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      Errors::RBDLError::RBDLError(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      local_3d9 = 0;
      __cxa_throw(uVar7,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    in_stack_fffffffffffffaf8 = (Model *)&stack0xfffffffffffffe70;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RSI + 0xb8),(ulong)in_EDX);
    get_dof_name_abi_cxx11_(in_stack_ffffffffffffff68);
    in_stack_fffffffffffffaf0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<((ostream *)in_stack_fffffffffffffaf8,local_400);
    std::operator<<((ostream *)in_stack_fffffffffffffaf0,", ");
    std::__cxx11::string::~string(local_400);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RSI + 0x30),(ulong)in_EDX);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
    in_EDX = *pvVar6;
  } while( true );
}

Assistant:

std::string print_hierarchy (const RigidBodyDynamics::Model &model,
                             unsigned int body_index = 0, int indent = 0)
{
  stringstream result ("");

  for (int j = 0; j < indent; j++) {
    result << "  ";
  }

  result << get_body_name (model, body_index);

  if (body_index > 0) {
    result << " [ ";
  }

  while (model.mBodies[body_index].mIsVirtual) {
    if (model.mu[body_index].size() == 0) {
      result << " end";
      break;
    } else if (model.mu[body_index].size() > 1) {
      std::ostringstream errormsg;
      errormsg << endl <<
               "Error: Cannot determine multi-dof joint as massless body with id " <<
               body_index << " (name: " << model.GetBodyName(body_index) <<
               ") has more than one child:" << endl;
      for (unsigned int ci = 0; ci < model.mu[body_index].size(); ci++) {
        errormsg << "  id: " << model.mu[body_index][ci] << " name: " <<
                 model.GetBodyName(model.mu[body_index][ci]) << endl;
      }
      throw Errors::RBDLError(errormsg.str());
    }

    result << get_dof_name(model.S[body_index]) << ", ";

    body_index = model.mu[body_index][0];
  }

  if (body_index > 0) {
    result << get_dof_name(model.S[body_index]) << " ]";
  }
  result << endl;

  unsigned int child_index = 0;
  for (child_index = 0; child_index < model.mu[body_index].size();
       child_index++) {
    result << print_hierarchy (model, model.mu[body_index][child_index],
                               indent + 1);
  }

  // print fixed children
  for (unsigned int fbody_index = 0; fbody_index < model.mFixedBodies.size();
       fbody_index++) {
    if (model.mFixedBodies[fbody_index].mMovableParent == body_index) {
      for (int j = 0; j < indent + 1; j++) {
        result << "  ";
      }

      result << model.GetBodyName(model.fixed_body_discriminator + fbody_index) <<
             " [fixed]" << endl;
    }
  }


  return result.str();
}